

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O0

ch_string * ch_loadstring(ch_context *vm,char *value,size_t size,_Bool copy_string)

{
  ch_context *key;
  ch_table *table;
  ch_primitive value_00;
  anon_union_8_4_dd993ae3_for_ch_primitive_1 local_58;
  ch_context *local_50;
  ch_string *string;
  char *copied_string;
  char *final_value;
  ch_string *interned_string;
  size_t sStack_28;
  _Bool copy_string_local;
  size_t size_local;
  char *value_local;
  ch_context *vm_local;
  
  interned_string._7_1_ = copy_string;
  sStack_28 = size;
  size_local = (size_t)value;
  value_local = (char *)vm;
  final_value = (char *)ch_table_find_string(&vm->strings,value,size);
  vm_local = (ch_context *)final_value;
  if ((ch_context *)final_value == (ch_context *)0x0) {
    copied_string = (char *)size_local;
    if ((interned_string._7_1_ & 1) != 0) {
      string = (ch_string *)malloc(sStack_28 + 1);
      memcpy(string,(void *)size_local,sStack_28);
      *(undefined1 *)((long)&(string->object).type + sStack_28) = 0;
      copied_string = (char *)string;
    }
    key = (ch_context *)new_string(copied_string,sStack_28);
    table = (ch_table *)(value_local + 0x1860);
    local_50 = key;
    memset(&local_58,0,8);
    value_00.field_1.number_value = local_58.number_value;
    value_00._0_8_ = 2;
    ch_table_set(table,(ch_string *)key,value_00);
    vm_local = local_50;
  }
  return (ch_string *)vm_local;
}

Assistant:

ch_string *ch_loadstring(ch_context *vm, const char *value, size_t size,
                         bool copy_string) {
  ch_string *interned_string = ch_table_find_string(&vm->strings, value, size);

  if (interned_string != NULL) {
    return interned_string;
  }

  const char *final_value = value;
  if (copy_string) {
    char *copied_string = malloc(size + 1);
    memcpy(copied_string, value, size);
    copied_string[size] = '\0';

    final_value = copied_string;
  }

  ch_string *string = new_string(final_value, size);
  ch_table_set(&vm->strings, string, MAKE_NULL());

  return string;
}